

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

bool __thiscall FxBinary::ResolveLR(FxBinary *this,FCompileContext *ctx,bool castnumeric)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool castnumeric_local;
  FCompileContext *ctx_local;
  FxBinary *this_local;
  
  if (this->left != (FxExpression *)0x0) {
    iVar2 = (*this->left->_vptr_FxExpression[2])(this->left,ctx);
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  if (this->right != (FxExpression *)0x0) {
    iVar2 = (*this->right->_vptr_FxExpression[2])(this->right,ctx);
    this->right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
  }
  if ((this->left == (FxExpression *)0x0) || (this->right == (FxExpression *)0x0)) {
    if (this != (FxBinary *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    this_local._7_1_ = false;
  }
  else {
    if ((this->left->ValueType == (PType *)TypeBool) &&
       (this->right->ValueType == (PType *)TypeBool)) {
      (this->super_FxExpression).ValueType = (PType *)TypeBool;
    }
    iVar2 = (*(this->left->ValueType->super_DObject)._vptr_DObject[0x12])();
    if ((iVar2 == 0) &&
       (iVar2 = (*(this->right->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 0)) {
      (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
    }
    else {
      bVar1 = FxExpression::IsNumeric(this->left);
      if ((bVar1) && (bVar1 = FxExpression::IsNumeric(this->right), bVar1)) {
        (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
      }
      else {
        iVar2 = (*(this->left->ValueType->super_DObject)._vptr_DObject[0x12])();
        if ((iVar2 == 3) && (this->left->ValueType == this->right->ValueType)) {
          (this->super_FxExpression).ValueType = this->left->ValueType;
        }
        else {
          (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FxBinary::ResolveLR(FCompileContext& ctx, bool castnumeric)
{
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return false;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	if (left->ValueType->GetRegType() == REGT_INT && right->ValueType->GetRegType() == REGT_INT)
	{
		ValueType = TypeSInt32;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		ValueType = TypeFloat64;
	}
	else if (left->ValueType->GetRegType() == REGT_POINTER && left->ValueType == right->ValueType)
	{
		ValueType = left->ValueType;
	}
	else
	{
		ValueType = TypeVoid;
	}

	if (castnumeric)
	{
		// later!
	}
	return true;
}